

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::VirtualNgon::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          VirtualNgon *this,Vector3d *position)

{
  bool bVar1;
  pointer this_00;
  Index IVar2;
  reference_type other;
  RealScalar local_1d0;
  Type local_1c8;
  Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
  local_190;
  Type local_150;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>_>
  local_118;
  undefined1 local_88 [8];
  VectorXd _pv;
  undefined1 local_60 [8];
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *region;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  *__range1;
  Vector3d *position_local;
  VirtualNgon *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ::begin(&this->_regions);
  region = (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
           std::
           vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ::end(&this->_regions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_*,_std::vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>_>
                                *)&region);
    if (!bVar1) {
      boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pv.super_type.m_storage.dummy_._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_*,_std::vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>_>
         ::operator*(&__end1);
    this_00 = std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>::
              operator->((unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *
                         )pv.super_type.m_storage.dummy_._8_8_);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               position);
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->_centreDownmix);
    RegionHandler::handleRemap
              ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_60,this_00,
               (Vector3d *)
               &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (int)IVar2 + 1);
    bVar1 = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator!
                      ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_60);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      other = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                        ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_60);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_88,other);
      IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
                (&local_150,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88,
                 IVar2 + -1);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
                (&local_1c8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88,1);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                (&local_190,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->_centreDownmix,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &local_1c8);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+
                (&local_118,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                 &local_150,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>_>
                  *)&local_190);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)local_88,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>_>_>
                  *)&local_118);
      local_1d0 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88,&local_1d0);
      boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional
                (__return_storage_ptr__,(rval_reference_type)local_88);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_88);
    }
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional
              ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_60);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_*,_std::vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> VirtualNgon::handle(
      Eigen::Vector3d position) const {
    for (const auto& region : _regions) {
      boost::optional<Eigen::VectorXd> pv = region->handleRemap(
          position, static_cast<int>(_centreDownmix.size() + 1));
      if (pv) {
        // downmix the last channel containing the virtual centre
        // speaker into the real speakers, and renormalise
        Eigen::VectorXd _pv = pv.get();
        _pv = _pv.head(_pv.size() - 1) + _centreDownmix * _pv.tail(1);
        _pv /= _pv.norm();
        return _pv;
      }
    }
    return boost::none;
  }